

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
          (ExclusiveJoinPromiseNode *this,Own<kj::_::PromiseNode> *left,
          Own<kj::_::PromiseNode> *right)

{
  Own<kj::_::PromiseNode> *pOVar1;
  Own<kj::_::PromiseNode> local_50 [2];
  Own<kj::_::PromiseNode> local_30;
  Own<kj::_::PromiseNode> *local_20;
  Own<kj::_::PromiseNode> *right_local;
  Own<kj::_::PromiseNode> *left_local;
  ExclusiveJoinPromiseNode *this_local;
  
  local_20 = right;
  right_local = left;
  left_local = (Own<kj::_::PromiseNode> *)this;
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00cdc768;
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>(left);
  Own<kj::_::PromiseNode>::Own(&local_30,pOVar1);
  Branch::Branch(&this->left,this,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>(right);
  Own<kj::_::PromiseNode>::Own(local_50,pOVar1);
  Branch::Branch(&this->right,this,local_50);
  Own<kj::_::PromiseNode>::~Own(local_50);
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(Own<PromiseNode> left, Own<PromiseNode> right)
    : left(*this, kj::mv(left)), right(*this, kj::mv(right)) {}